

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_keyx.c
# Opt level: O0

int gost_keg(uchar *ukm_source,int pkey_nid,EC_POINT *pub_key,EC_KEY *priv_key,uchar *keyout)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  int iVar7;
  uchar *in_RCX;
  uchar *in_RDX;
  int in_ESI;
  EC_POINT *in_RDI;
  size_t in_R8;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  byte bVar23;
  size_t unaff_retaddr;
  uchar tmpkey [32];
  size_t keylen;
  uchar real_ukm [16];
  long local_90;
  undefined1 local_78 [40];
  uchar *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  size_t keylen_00;
  uchar *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  memset(&stack0xffffffffffffffb8,0,0x10);
  cVar8 = -(*in_RDI == SUB81(in_stack_ffffffffffffffb8,0));
  cVar9 = -(in_RDI[1] == SUB81((ulong)in_stack_ffffffffffffffb8 >> 8,0));
  cVar10 = -(in_RDI[2] == SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x10,0));
  cVar11 = -(in_RDI[3] == SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x18,0));
  cVar12 = -(in_RDI[4] == SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x20,0));
  cVar13 = -(in_RDI[5] == SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x28,0));
  cVar14 = -(in_RDI[6] == SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x30,0));
  cVar15 = -(in_RDI[7] == SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
  cVar16 = -(in_RDI[8] == SUB81(in_stack_ffffffffffffffc0,0));
  cVar17 = -(in_RDI[9] == SUB81((ulong)in_stack_ffffffffffffffc0 >> 8,0));
  cVar18 = -(in_RDI[10] == SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x10,0));
  cVar19 = -(in_RDI[0xb] == SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x18,0));
  cVar20 = -(in_RDI[0xc] == SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x20,0));
  cVar21 = -(in_RDI[0xd] == SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x28,0));
  cVar22 = -(in_RDI[0xe] == SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x30,0));
  bVar23 = -(in_RDI[0xf] == SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0));
  auVar1[1] = cVar9;
  auVar1[0] = cVar8;
  auVar1[2] = cVar10;
  auVar1[3] = cVar11;
  auVar1[4] = cVar12;
  auVar1[5] = cVar13;
  auVar1[6] = cVar14;
  auVar1[7] = cVar15;
  auVar1[8] = cVar16;
  auVar1[9] = cVar17;
  auVar1[10] = cVar18;
  auVar1[0xb] = cVar19;
  auVar1[0xc] = cVar20;
  auVar1[0xd] = cVar21;
  auVar1[0xe] = cVar22;
  auVar1[0xf] = bVar23;
  auVar2[1] = cVar9;
  auVar2[0] = cVar8;
  auVar2[2] = cVar10;
  auVar2[3] = cVar11;
  auVar2[4] = cVar12;
  auVar2[5] = cVar13;
  auVar2[6] = cVar14;
  auVar2[7] = cVar15;
  auVar2[8] = cVar16;
  auVar2[9] = cVar17;
  auVar2[10] = cVar18;
  auVar2[0xb] = cVar19;
  auVar2[0xc] = cVar20;
  auVar2[0xd] = cVar21;
  auVar2[0xe] = cVar22;
  auVar2[0xf] = bVar23;
  auVar6[1] = cVar11;
  auVar6[0] = cVar10;
  auVar6[2] = cVar12;
  auVar6[3] = cVar13;
  auVar6[4] = cVar14;
  auVar6[5] = cVar15;
  auVar6[6] = cVar16;
  auVar6[7] = cVar17;
  auVar6[8] = cVar18;
  auVar6[9] = cVar19;
  auVar6[10] = cVar20;
  auVar6[0xb] = cVar21;
  auVar6[0xc] = cVar22;
  auVar6[0xd] = bVar23;
  auVar5[1] = cVar12;
  auVar5[0] = cVar11;
  auVar5[2] = cVar13;
  auVar5[3] = cVar14;
  auVar5[4] = cVar15;
  auVar5[5] = cVar16;
  auVar5[6] = cVar17;
  auVar5[7] = cVar18;
  auVar5[8] = cVar19;
  auVar5[9] = cVar20;
  auVar5[10] = cVar21;
  auVar5[0xb] = cVar22;
  auVar5[0xc] = bVar23;
  auVar4[1] = cVar13;
  auVar4[0] = cVar12;
  auVar4[2] = cVar14;
  auVar4[3] = cVar15;
  auVar4[4] = cVar16;
  auVar4[5] = cVar17;
  auVar4[6] = cVar18;
  auVar4[7] = cVar19;
  auVar4[8] = cVar20;
  auVar4[9] = cVar21;
  auVar4[10] = cVar22;
  auVar4[0xb] = bVar23;
  auVar3[1] = cVar14;
  auVar3[0] = cVar13;
  auVar3[2] = cVar15;
  auVar3[3] = cVar16;
  auVar3[4] = cVar17;
  auVar3[5] = cVar18;
  auVar3[6] = cVar19;
  auVar3[7] = cVar20;
  auVar3[8] = cVar21;
  auVar3[9] = cVar22;
  auVar3[10] = bVar23;
  if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
               (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 | (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
               (ushort)((byte)(CONCAT19(bVar23,CONCAT18(cVar22,CONCAT17(cVar21,CONCAT16(cVar20,
                                                  CONCAT15(cVar19,CONCAT14(cVar18,CONCAT13(cVar17,
                                                  CONCAT12(cVar16,CONCAT11(cVar15,cVar14))))))))) >>
                              7) & 1) << 6 |
               (ushort)((byte)(CONCAT18(bVar23,CONCAT17(cVar22,CONCAT16(cVar21,CONCAT15(cVar20,
                                                  CONCAT14(cVar19,CONCAT13(cVar18,CONCAT12(cVar17,
                                                  CONCAT11(cVar16,cVar15)))))))) >> 7) & 1) << 7 |
              (ushort)(bVar23 >> 7) << 0xf) == 0xffff) {
    keylen_00 = CONCAT17(1,(int7)in_stack_ffffffffffffffc0);
  }
  else {
    in_stack_ffffffffffffffb8 = *(uchar **)in_RDI;
    keylen_00 = *(size_t *)(in_RDI + 8);
    BUF_reverse(&stack0xffffffffffffffb8,(uchar *)0x0,0x10);
  }
  iVar7 = (int)(in_R8 >> 0x20);
  if (in_ESI == 0x3d3) {
    iVar7 = VKO_compute_key((uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            in_RDI,(EC_KEY *)CONCAT44(0x3d3,in_stack_ffffffffffffffe8),in_RDX,
                            (size_t)in_RCX,iVar7);
    if ((long)iVar7 == 0) {
      iVar7 = 0;
    }
    else {
      iVar7 = gost_kdftree2012_256
                        (in_RCX,in_R8,in_stack_ffffffffffffffc8,keylen_00,in_stack_ffffffffffffffb8,
                         (long)iVar7,(uchar *)in_RDI,
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),unaff_retaddr
                        );
      if (iVar7 < 1) {
        local_90 = 0;
      }
      else {
        local_90 = 0x40;
      }
      OPENSSL_cleanse(local_78,0x20);
      if (local_90 == 0) {
        local_90 = 0;
      }
      iVar7 = (int)local_90;
    }
  }
  else if (in_ESI == 0x3d4) {
    iVar7 = VKO_compute_key((uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            in_RDI,(EC_KEY *)CONCAT44(0x3d4,in_stack_ffffffffffffffe8),in_RDX,
                            (size_t)in_RCX,iVar7);
    if (iVar7 == 0) {
      iVar7 = 0;
    }
  }
  else {
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int gost_keg(const unsigned char *ukm_source, int pkey_nid,
                    const EC_POINT *pub_key, const EC_KEY *priv_key,
                    unsigned char *keyout)
{
/* Adjust UKM */
    unsigned char real_ukm[16];
    size_t keylen = 0;

    memset(real_ukm, 0, 16);
    if (memcmp(ukm_source, real_ukm, 16) == 0)
        real_ukm[15] = 1;
    else {
        memcpy(real_ukm, ukm_source, 16);
        BUF_reverse(real_ukm, NULL, 16);
    }

    switch (pkey_nid) {
    case NID_id_GostR3410_2012_512:
        keylen =
            VKO_compute_key(keyout, pub_key, priv_key, real_ukm, 16,
                            NID_id_GostR3411_2012_512);
        return (keylen) ? keylen : 0;
        break;

    case NID_id_GostR3410_2012_256:
        {
            unsigned char tmpkey[32];
            keylen =
              VKO_compute_key(tmpkey, pub_key, priv_key, real_ukm, 16,
                  NID_id_GostR3411_2012_256);

            if (keylen == 0)
                return 0;

            if (gost_kdftree2012_256
                (keyout, 64, tmpkey, 32, (const unsigned char *)"kdf tree", 8,
                 ukm_source + 16, 8, 1) > 0)
                keylen = 64;
            else
                keylen = 0;

            OPENSSL_cleanse(tmpkey, 32);
            return (keylen) ? keylen : 0;
        }
    default:
        return 0;
    }
}